

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O0

void object_skeleton_set_property(GObject *gobject,guint prop_id,GValue *value,GParamSpec *pspec)

{
  gchar *pgVar1;
  GType GVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 uVar5;
  guint _glib__property_id;
  GParamSpec *_glib__pspec;
  GObject *_glib__object;
  gboolean __r;
  GType __t;
  GTypeInstance *__inst;
  GDBusInterfaceSkeleton *interface;
  ObjectSkeleton *object;
  GParamSpec *pspec_local;
  GValue *value_local;
  guint prop_id_local;
  GObject *gobject_local;
  
  GVar2 = object_skeleton_get_type();
  uVar3 = g_type_check_instance_cast(gobject,GVar2);
  if (prop_id == 1) {
    plVar4 = (long *)g_value_get_object(value);
    if (plVar4 == (long *)0x0) {
      uVar5 = g_dbus_object_skeleton_get_type();
      uVar3 = g_type_check_instance_cast(uVar3,uVar5);
      g_dbus_object_skeleton_remove_interface_by_name(uVar3,"io.mangoh.Testing.Greetable");
    }
    else {
      GVar2 = greetable_get_type();
      if (plVar4 == (long *)0x0) {
        _glib__object._4_4_ = 0;
      }
      else if ((*plVar4 == 0) || (*(GType *)*plVar4 != GVar2)) {
        _glib__object._4_4_ = g_type_check_instance_is_a(plVar4,GVar2);
      }
      else {
        _glib__object._4_4_ = 1;
      }
      if (_glib__object._4_4_ == 0) {
        g_warn_message(0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dpfrey[P]D-Bus_Example/build_O0/basics_gen.c"
                       ,0x6c6,"object_skeleton_set_property","IS_GREETABLE (interface)");
      }
      uVar5 = g_dbus_object_skeleton_get_type();
      uVar3 = g_type_check_instance_cast(uVar3,uVar5);
      g_dbus_object_skeleton_add_interface(uVar3,plVar4);
    }
  }
  else {
    pgVar1 = pspec->name;
    uVar3 = g_type_name(((pspec->g_type_instance).g_class)->g_type);
    uVar5 = g_type_name(((gobject->g_type_instance).g_class)->g_type);
    g_log(0,0x10,"%s:%d: invalid %s id %u for \"%s\" of type \'%s\' in \'%s\'",
          "/workspace/llm4binary/github/license_all_cmakelists_25/dpfrey[P]D-Bus_Example/build_O0/basics_gen.c"
          ,0x6d0,"property",prop_id,pgVar1,uVar3,uVar5);
  }
  return;
}

Assistant:

static void
object_skeleton_set_property (GObject      *gobject,
  guint         prop_id,
  const GValue *value,
  GParamSpec   *pspec)
{
  ObjectSkeleton *object = OBJECT_SKELETON (gobject);
  GDBusInterfaceSkeleton *interface;

  switch (prop_id)
    {
    case 1:
      interface = g_value_get_object (value);
      if (interface != NULL)
        {
          g_warn_if_fail (IS_GREETABLE (interface));
          g_dbus_object_skeleton_add_interface (G_DBUS_OBJECT_SKELETON (object), interface);
        }
      else
        {
          g_dbus_object_skeleton_remove_interface_by_name (G_DBUS_OBJECT_SKELETON (object), "io.mangoh.Testing.Greetable");
        }
      break;

    default:
      G_OBJECT_WARN_INVALID_PROPERTY_ID (gobject, prop_id, pspec);
      break;
  }
}